

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_feature_tests.cpp
# Opt level: O2

void __thiscall iu_Optional_x_iutest_x_Compare_Test::Body(iu_Optional_x_iutest_x_Compare_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestFlag *pTVar2;
  optional<int> *in_R9;
  ScopedSPITestFlag guard;
  SPIFailureChecker iutest_failure_checker;
  AssertionResult iutest_ar_1;
  optional<int> opt_1;
  bool local_1d8;
  AssertionResult iutest_spi_ar;
  AssertionResult iutest_ar;
  
  opt_1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
  _M_payload._M_value = 0;
  paVar1 = &iutest_ar.m_message.field_2;
  iutest_ar.m_message._M_string_length = 0;
  opt_1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
  _M_engaged = true;
  iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
  iutest_ar.m_result = true;
  iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::~string((string *)&iutest_ar);
  iutest_ar.m_message._M_dataplus._M_p = iutest_ar.m_message._M_dataplus._M_p & 0xffffffff00000000;
  iutest::internal::CmpHelperEQ<int,std::optional<int>>
            (&iutest_ar_1,(internal *)0x13e327,"opt",(char *)&iutest_ar,(int *)&opt_1,in_R9);
  if (iutest_ar_1.m_result == false) {
    memset(&iutest_ar,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_ar);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
               ,0x53,iutest_ar_1.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&iutest_ar);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_ar);
  }
  std::__cxx11::string::~string((string *)&iutest_ar_1);
  opt_1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>._4_4_ =
       opt_1.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
       _4_4_ & 0xffffff00;
  iutest::internal::CmpHelperEQ<std::nullopt_t,std::optional<int>>
            (&iutest_ar_1,(internal *)"::std::nullopt","opt","",(nullopt_t *)&opt_1,in_R9);
  if (iutest_ar_1.m_result == false) {
    memset(&iutest_ar,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_ar);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
               ,0x57,iutest_ar_1.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&iutest_ar);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_ar);
  }
  std::__cxx11::string::~string((string *)&iutest_ar_1);
  iutest_ar.m_message._M_string_length = 0;
  iutest_ar.m_message.field_2._M_local_buf[0] = '\0';
  iutest_ar.m_result = true;
  iutest_ar.m_message._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::~string((string *)&iutest_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kNonFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  iutest_ar.m_message._M_dataplus._M_p._0_4_ = 0x4d2;
  iutest::internal::CmpHelperEQ<int,std::optional<int>>
            ((AssertionResult *)&opt_1,(internal *)"1234","opt",(char *)&iutest_ar,(int *)&Body::opt
             ,in_R9);
  if (local_1d8 == false) {
    memset(&iutest_ar,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_ar);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_ar_1,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
               ,0x5c,(char *)CONCAT44(opt_1.super__Optional_base<int,_true,_true>._M_payload.
                                      super__Optional_payload_base<int>._4_4_,
                                      opt_1.super__Optional_base<int,_true,_true>._M_payload.
                                      super__Optional_payload_base<int>._M_payload._M_value));
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_1,(Fixed *)&iutest_ar);
    std::__cxx11::string::~string((string *)&iutest_ar_1);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_ar);
  }
  std::__cxx11::string::~string((string *)&opt_1);
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = (int)guard.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&iutest_ar,"1234",(allocator<char> *)&iutest_ar_1);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,&iutest_ar.m_message);
  std::__cxx11::string::~string((string *)&iutest_ar);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(&iutest_ar,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_ar);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
               ,0x5c,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&iutest_failure_checker,(Fixed *)&iutest_ar);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_ar);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  return;
}

Assistant:

IUTEST(Optional, Compare)
{
    {
        ::std::optional<int> opt = 0;
        IUTEST_EXPECT_TRUE(opt);
        IUTEST_EXPECT_EQ(0, opt);
    }
    {
        ::std::optional<int> opt = ::std::nullopt;
        IUTEST_EXPECT_EQ(::std::nullopt, opt);
    }
    {
        static const ::std::optional<int> opt = ::std::nullopt;
        IUTEST_EXPECT_FALSE(opt);
        IUTEST_EXPECT_NONFATAL_FAILURE(IUTEST_EXPECT_EQ(1234, opt), "1234");
    }
}